

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matmul.c
# Opt level: O0

MATRIX mat_mul(MATRIX A,MATRIX B)

{
  long in_RSI;
  long in_RDI;
  MATRIX C;
  int k;
  int j;
  int i;
  undefined8 in_stack_ffffffffffffffd0;
  int in_stack_ffffffffffffffd8;
  int in_stack_ffffffffffffffdc;
  int iVar1;
  int local_20;
  int local_1c;
  MATRIX local_8;
  
  local_8 = mat_creat(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8,
                      (int)((ulong)in_stack_ffffffffffffffd0 >> 0x20));
  if (local_8 == (MATRIX)0x0) {
    local_8 = (MATRIX)0x0;
  }
  else {
    for (local_1c = 0; local_1c < *(int *)(in_RDI + -8); local_1c = local_1c + 1) {
      for (local_20 = 0; local_20 < *(int *)(in_RSI + -4); local_20 = local_20 + 1) {
        local_8[local_1c][local_20] = 0.0;
        for (iVar1 = 0; iVar1 < *(int *)(in_RDI + -4); iVar1 = iVar1 + 1) {
          local_8[local_1c][local_20] =
               *(double *)(*(long *)(in_RDI + (long)local_1c * 8) + (long)iVar1 * 8) *
               *(double *)(*(long *)(in_RSI + (long)iVar1 * 8) + (long)local_20 * 8) +
               local_8[local_1c][local_20];
        }
      }
    }
  }
  return local_8;
}

Assistant:

MATRIX mat_mul( MATRIX A, MATRIX B )
{
	int	i, j, k;
	MATRIX	C;

	if ((C = mat_creat( MatRow(A), MatCol(B), UNDEFINED )) == NULL)
		return (NULL);

	for (i=0; i<MatRow(A); i++)
	for (j=0; j<MatCol(B); j++)
	for (k=0, C[i][j]=0.0; k<MatCol(A); k++)
		{
		C[i][j] += A[i][k] * B[k][j];
		}
	return (C);
}